

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhighdpiscaling.cpp
# Opt level: O3

optional<QByteArray> *
qEnvironmentVariableOptionalByteArray(optional<QByteArray> *__return_storage_ptr__,char *name)

{
  long in_FS_OFFSET;
  QArrayData *local_38;
  char *pcStack_30;
  undefined1 *local_28;
  optional<QByteArray> *local_18;
  
  local_18 = *(optional<QByteArray> **)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv((char *)&local_38);
  if (pcStack_30 == (char *)0x0) {
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_engaged = false;
    if (local_38 != (QArrayData *)0x0) {
      LOCK();
      (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_38,1,0x10);
      }
    }
  }
  else {
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_payload._M_value.d.d = (Data *)local_38;
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_payload._M_value.d.ptr = pcStack_30;
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_payload._M_value.d.size = (qsizetype)local_28;
    (__return_storage_ptr__->super__Optional_base<QByteArray,_false,_false>)._M_payload.
    super__Optional_payload<QByteArray,_true,_false,_false>.super__Optional_payload_base<QByteArray>
    ._M_engaged = true;
  }
  if (*(optional<QByteArray> **)(in_FS_OFFSET + 0x28) == local_18) {
    return *(optional<QByteArray> **)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

static std::optional<QByteArray> qEnvironmentVariableOptionalByteArray(const char *name)
{
    QByteArray value = qgetenv(name);
    return value.isNull() ? std::nullopt : std::optional(std::move(value));
}